

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O3

void __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::instantiate(ModuleRunnerBase<wasm::ModuleRunner> *this)

{
  pointer puVar1;
  Global *__k;
  char *pcVar2;
  size_t sVar3;
  SmallVector<wasm::Literal,_1UL> *this_00;
  Module *pMVar4;
  unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *import;
  pointer puVar5;
  Name name;
  Literals local_f8;
  SmallVector<wasm::Literal,_1UL> local_c0;
  size_t sStack_88;
  Literals arguments;
  
  (*this->externalInterface->_vptr_ExternalInterface[3])
            (this->externalInterface,&this->globals,this->wasm);
  pMVar4 = this->wasm;
  puVar5 = (pMVar4->globals).
           super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (pMVar4->globals).
           super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar5 != puVar1) {
    do {
      __k = (puVar5->_M_t).super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>.
            _M_t.super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
            super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
      if ((__k->super_Importable).module.super_IString.str._M_str == (char *)0x0) {
        ExpressionRunner<wasm::ModuleRunner>::visit
                  ((Flow *)&stack0xffffffffffffff78,
                   &this->super_ExpressionRunner<wasm::ModuleRunner>,__k->init);
        this_00 = &std::
                   map<wasm::Name,_wasm::Literals,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Literals>_>_>
                   ::operator[](&this->globals,(key_type *)__k)->
                   super_SmallVector<wasm::Literal,_1UL>;
        SmallVector<wasm::Literal,_1UL>::operator=
                  (this_00,(SmallVector<wasm::Literal,_1UL> *)&stack0xffffffffffffff78);
        std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
                  ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
                   &arguments.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type);
        wasm::Literal::~Literal((Literal *)&arguments);
      }
      puVar5 = puVar5 + 1;
    } while (puVar5 != puVar1);
    pMVar4 = this->wasm;
  }
  (*this->externalInterface->_vptr_ExternalInterface[2])(this->externalInterface,pMVar4,this);
  initializeTableContents(this);
  initializeMemoryContents(this);
  pcVar2 = (this->wasm->start).super_IString.str._M_str;
  if (pcVar2 != (char *)0x0) {
    arguments.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id = 0;
    arguments.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    arguments.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.i64 = 0;
    arguments.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.func.super_IString.str
    ._M_str = (char *)0x0;
    sStack_88 = 0;
    arguments.super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
    arguments.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    sVar3 = (this->wasm->start).super_IString.str._M_len;
    SmallVector<wasm::Literal,_1UL>::SmallVector
              (&local_c0,(SmallVector<wasm::Literal,_1UL> *)&stack0xffffffffffffff78);
    name.super_IString.str._M_str = pcVar2;
    name.super_IString.str._M_len = sVar3;
    callFunction(&local_f8,this,name,(Literals *)&local_c0);
    std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
              (&local_f8.super_SmallVector<wasm::Literal,_1UL>.flexible);
    wasm::Literal::~Literal(local_f8.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems);
    std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector(&local_c0.flexible);
    wasm::Literal::~Literal(local_c0.fixed._M_elems);
    std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
              ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
               &arguments.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type);
    wasm::Literal::~Literal((Literal *)&arguments);
  }
  return;
}

Assistant:

void instantiate() {
    // import globals from the outside
    externalInterface->importGlobals(globals, wasm);
    // generate internal (non-imported) globals
    ModuleUtils::iterDefinedGlobals(wasm, [&](Global* global) {
      globals[global->name] = self()->visit(global->init).values;
    });

    // initialize the rest of the external interface
    externalInterface->init(wasm, *self());

    initializeTableContents();
    initializeMemoryContents();

    // run start, if present
    if (wasm.start.is()) {
      Literals arguments;
      callFunction(wasm.start, arguments);
    }
  }